

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-window.cc
# Opt level: O2

void __thiscall Debugger::MemoryWindow::MemoryWindow(MemoryWindow *this,Debugger *d)

{
  (this->super_Window).d = d;
  (this->super_Window).is_open = true;
  *(undefined4 *)&(this->super_Window).field_0xc = 0;
  MemoryEditor::MemoryEditor(&this->memory_editor);
  this->memory_editor_base = 0;
  (this->memory_editor).FnUserData = this;
  (this->memory_editor).ReadFn = MemoryWindow::anon_class_1_0_00000001::__invoke;
  (this->memory_editor).WriteFn = MemoryWindow::anon_class_1_0_00000001::__invoke;
  return;
}

Assistant:

Debugger::MemoryWindow::MemoryWindow(Debugger* d) : Window(d) {
  memory_editor.FnUserData = this;
  memory_editor.ReadFn = [](const u8*, size_t addr, void* user_data) {
    MemoryWindow* this_ = static_cast<MemoryWindow*>(user_data);
    return emulator_read_u8_raw(this_->d->e, this_->memory_editor_base + addr);
  };
  memory_editor.WriteFn = [](u8*, size_t addr, u8 value, void* user_data) {
    MemoryWindow* this_ = static_cast<MemoryWindow*>(user_data);
    emulator_write_u8_raw(this_->d->e, this_->memory_editor_base + addr, value);
  };
}